

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DylibBundler.cpp
# Opt level: O3

void addDependency(string *path,string *filename)

{
  pointer pcVar1;
  bool bVar2;
  mapped_type *pmVar3;
  long lVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  byte bVar8;
  vector<Dependency,_std::allocator<Dependency>_> deps_in_file;
  Dependency dep;
  vector<Dependency,_std::allocator<Dependency>_> local_100;
  string local_e8;
  string local_c8;
  Dependency local_a8;
  
  pcVar1 = (path->_M_dataplus)._M_p;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar1,pcVar1 + path->_M_string_length);
  Dependency::Dependency(&local_a8,&local_c8,filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  uVar6 = (int)((long)deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x11111111;
  if ((int)uVar6 < 1) {
    bVar8 = 0;
  }
  else {
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    lVar4 = 0;
    bVar8 = 0;
    do {
      bVar2 = Dependency::mergeIfSameAs
                        (&local_a8,
                         (Dependency *)
                         ((long)&((deps.super__Vector_base<Dependency,_std::allocator<Dependency>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->filename)._M_dataplus.
                                 _M_p + lVar4));
      bVar8 = bVar8 | bVar2;
      lVar4 = lVar4 + 0x78;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
           ::operator[](&deps_per_file_abi_cxx11_,filename);
  std::vector<Dependency,_std::allocator<Dependency>_>::vector(&local_100,pmVar3);
  uVar6 = (int)((long)local_100.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)local_100.super__Vector_base<Dependency,_std::allocator<Dependency>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) * -0x11111111;
  if ((int)uVar6 < 1) {
    bVar5 = 0;
  }
  else {
    uVar7 = (ulong)(uVar6 & 0x7fffffff);
    lVar4 = 0;
    bVar5 = 0;
    do {
      bVar2 = Dependency::mergeIfSameAs
                        (&local_a8,
                         (Dependency *)
                         ((long)&((local_100.
                                   super__Vector_base<Dependency,_std::allocator<Dependency>_>.
                                   _M_impl.super__Vector_impl_data._M_start)->filename)._M_dataplus.
                                 _M_p + lVar4));
      bVar5 = bVar5 | bVar2;
      lVar4 = lVar4 + 0x78;
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
  }
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e8,local_a8.prefix._M_dataplus._M_p,
             local_a8.prefix._M_dataplus._M_p + local_a8.prefix._M_string_length);
  bVar2 = Settings::isPrefixBundled(&local_e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (bVar2) {
    if (bVar8 == 0) {
      std::vector<Dependency,_std::allocator<Dependency>_>::push_back(&deps,&local_a8);
    }
    if (bVar5 == 0) {
      pmVar3 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Dependency,_std::allocator<Dependency>_>_>_>_>
               ::operator[](&deps_per_file_abi_cxx11_,filename);
      std::vector<Dependency,_std::allocator<Dependency>_>::push_back(pmVar3,&local_a8);
    }
  }
  std::vector<Dependency,_std::allocator<Dependency>_>::~vector(&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.new_name._M_dataplus._M_p != &local_a8.new_name.field_2) {
    operator_delete(local_a8.new_name._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8.symlinks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.prefix._M_dataplus._M_p != &local_a8.prefix.field_2) {
    operator_delete(local_a8.prefix._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.filename._M_dataplus._M_p != &local_a8.filename.field_2) {
    operator_delete(local_a8.filename._M_dataplus._M_p);
  }
  return;
}

Assistant:

void addDependency(const std::string& path, const std::string& filename)
{
    Dependency dep(path, filename);
    
    // we need to check if this library was already added to avoid duplicates
    bool in_deps = false;
    const int dep_amount = deps.size();
    for(int n=0; n<dep_amount; n++)
    {
        if(dep.mergeIfSameAs(deps[n])) in_deps = true;
    }
    
    // check if this library was already added to |deps_per_file[filename]| to avoid duplicates
    std::vector<Dependency> deps_in_file = deps_per_file[filename];
    bool in_deps_per_file = false;
    const int deps_in_file_amount = deps_in_file.size();
    for(int n=0; n<deps_in_file_amount; n++)
    {
        if(dep.mergeIfSameAs(deps_in_file[n])) in_deps_per_file = true;
    }

    if(!Settings::isPrefixBundled(dep.getPrefix())) return;
    
    if(!in_deps) deps.push_back(dep);
    if(!in_deps_per_file) deps_per_file[filename].push_back(dep);
}